

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::FCDUTF8CollationIterator::nextCodePoint
          (FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  byte bVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  byte local_26;
  byte local_25;
  uint local_24;
  uint8_t __t_1;
  uint8_t __t;
  UChar32 c;
  UErrorCode *errorCode_local;
  FCDUTF8CollationIterator *this_local;
  
  do {
    while (this->state != CHECK_FWD) {
      if ((this->state == IN_FCD_SEGMENT) &&
         ((this->super_UTF8CollationIterator).pos != this->limit)) {
        iVar3 = (this->super_UTF8CollationIterator).pos;
        (this->super_UTF8CollationIterator).pos = iVar3 + 1;
        bVar1 = (this->super_UTF8CollationIterator).u8[iVar3];
        local_24 = (uint)bVar1;
        if ((bVar1 & 0x80) == 0) {
          return local_24;
        }
        if ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length) {
          return 0xfffd;
        }
        if (local_24 < 0xe0) {
          if (local_24 < 0xc2) {
            return 0xfffd;
          }
          local_24 = local_24 & 0x1f;
        }
        else {
          if (local_24 < 0xf0) {
            local_24 = local_24 & 0xf;
            local_26 = (this->super_UTF8CollationIterator).u8
                       [(this->super_UTF8CollationIterator).pos];
            if (((int)" 000000000000\x1000"[(int)local_24] & 1 << (sbyte)((int)(uint)local_26 >> 5))
                == 0) {
              return 0xfffd;
            }
            local_26 = local_26 & 0x3f;
          }
          else {
            iVar3 = local_24 - 0xf0;
            if (4 < iVar3) {
              return 0xfffd;
            }
            bVar1 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos];
            if (((int)""[(int)(uint)bVar1 >> 4] & 1 << ((byte)iVar3 & 0x1f)) == 0) {
              return 0xfffd;
            }
            local_24 = iVar3 * 0x40 | bVar1 & 0x3f;
            iVar3 = (this->super_UTF8CollationIterator).pos + 1;
            (this->super_UTF8CollationIterator).pos = iVar3;
            if (iVar3 == (this->super_UTF8CollationIterator).length) {
              return 0xfffd;
            }
            local_26 = (this->super_UTF8CollationIterator).u8
                       [(this->super_UTF8CollationIterator).pos] + 0x80;
            if (0x3f < local_26) {
              return 0xfffd;
            }
          }
          local_24 = local_24 << 6 | (uint)local_26;
          iVar3 = (this->super_UTF8CollationIterator).pos + 1;
          (this->super_UTF8CollationIterator).pos = iVar3;
          if (iVar3 == (this->super_UTF8CollationIterator).length) {
            return 0xfffd;
          }
        }
        bVar1 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos] +
                0x80;
        if (0x3f < bVar1) {
          return 0xfffd;
        }
        (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + 1;
        return local_24 << 6 | (uint)bVar1;
      }
      if ((this->state == IN_NORMALIZED) &&
         (iVar3 = (this->super_UTF8CollationIterator).pos,
         iVar4 = UnicodeString::length(&this->normalized), iVar3 != iVar4)) {
        uVar5 = UnicodeString::char32At(&this->normalized,(this->super_UTF8CollationIterator).pos);
        iVar3 = 2;
        if (uVar5 < 0x10000) {
          iVar3 = 1;
        }
        (this->super_UTF8CollationIterator).pos = iVar3 + (this->super_UTF8CollationIterator).pos;
        return uVar5;
      }
      switchToForward(this);
    }
    if ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length) {
      return -1;
    }
    bVar1 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos];
    if ((bVar1 == 0) && ((this->super_UTF8CollationIterator).length < 0)) {
      return -1;
    }
    if ((bVar1 & 0x80) == 0) {
      (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + 1;
      return (uint)bVar1;
    }
    iVar3 = (this->super_UTF8CollationIterator).pos;
    (this->super_UTF8CollationIterator).pos = iVar3 + 1;
    bVar1 = (this->super_UTF8CollationIterator).u8[iVar3];
    local_24 = (uint)bVar1;
    if ((bVar1 & 0x80) != 0) {
      if ((this->super_UTF8CollationIterator).pos != (this->super_UTF8CollationIterator).length) {
        if (local_24 < 0xe0) {
          if (0xc1 < local_24) {
            local_24 = local_24 & 0x1f;
LAB_00283f1e:
            bVar1 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos]
                    + 0x80;
            if (bVar1 < 0x40) {
              local_24 = local_24 << 6 | (uint)bVar1;
              (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + 1;
              goto LAB_00283f79;
            }
          }
        }
        else if (local_24 < 0xf0) {
          local_24 = local_24 & 0xf;
          local_25 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos]
          ;
          if (((int)" 000000000000\x1000"[(int)local_24] & 1 << (sbyte)((int)(uint)local_25 >> 5))
              != 0) {
            local_25 = local_25 & 0x3f;
LAB_00283ed8:
            local_24 = local_24 << 6 | (uint)local_25;
            iVar3 = (this->super_UTF8CollationIterator).pos + 1;
            (this->super_UTF8CollationIterator).pos = iVar3;
            if (iVar3 != (this->super_UTF8CollationIterator).length) goto LAB_00283f1e;
          }
        }
        else {
          iVar3 = local_24 - 0xf0;
          if ((iVar3 < 5) &&
             (bVar1 = (this->super_UTF8CollationIterator).u8
                      [(this->super_UTF8CollationIterator).pos],
             ((int)""[(int)(uint)bVar1 >> 4] & 1 << ((byte)iVar3 & 0x1f)) != 0)) {
            local_24 = iVar3 * 0x40 | bVar1 & 0x3f;
            iVar3 = (this->super_UTF8CollationIterator).pos + 1;
            (this->super_UTF8CollationIterator).pos = iVar3;
            if ((iVar3 != (this->super_UTF8CollationIterator).length) &&
               (local_25 = (this->super_UTF8CollationIterator).u8
                           [(this->super_UTF8CollationIterator).pos] + 0x80, local_25 < 0x40))
            goto LAB_00283ed8;
          }
        }
      }
      local_24 = 0xfffd;
    }
LAB_00283f79:
    if ((int)local_24 < 0x10000) {
      local_34 = local_24;
    }
    else {
      local_34 = ((int)local_24 >> 10) + 0xd7c0U & 0xffff;
    }
    UVar2 = CollationFCD::hasTccc(local_34);
    if ((UVar2 == '\0') ||
       ((UVar2 = CollationFCD::maybeTibetanCompositeVowel(local_24), UVar2 == '\0' &&
        (((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length ||
         (UVar2 = nextHasLccc(this), UVar2 == '\0')))))) {
      return local_24;
    }
    if (local_24 < 0x80) {
      local_38 = 1;
    }
    else {
      if (local_24 < 0x800) {
        local_3c = 2;
      }
      else {
        if (local_24 < 0xd800) {
          local_40 = 3;
        }
        else {
          if ((local_24 < 0xe000) || (0x10ffff < local_24)) {
            local_44 = 0;
          }
          else {
            local_44 = 4;
            if (local_24 < 0x10000) {
              local_44 = 3;
            }
          }
          local_40 = local_44;
        }
        local_3c = local_40;
      }
      local_38 = local_3c;
    }
    (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos - local_38;
    UVar2 = nextSegment(this,errorCode);
    if (UVar2 == '\0') {
      return -1;
    }
  } while( true );
}

Assistant:

UChar32
FCDUTF8CollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == CHECK_FWD) {
            if(pos == length || ((c = u8[pos]) == 0 && length < 0)) {
                return U_SENTINEL;
            }
            if(U8_IS_SINGLE(c)) {
                ++pos;
                return c;
            }
            U8_NEXT_OR_FFFD(u8, pos, length, c);
            if(CollationFCD::hasTccc(c <= 0xffff ? c : U16_LEAD(c)) &&
                    (CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != length && nextHasLccc()))) {
                // c is not FCD-inert, therefore it is not U+FFFD and it has a valid byte sequence
                // and we can use U8_LENGTH() rather than a previous-position variable.
                pos -= U8_LENGTH(c);
                if(!nextSegment(errorCode)) {
                    return U_SENTINEL;
                }
                continue;
            }
            return c;
        } else if(state == IN_FCD_SEGMENT && pos != limit) {
            U8_NEXT_OR_FFFD(u8, pos, length, c);
            return c;
        } else if(state == IN_NORMALIZED && pos != normalized.length()) {
            c = normalized.char32At(pos);
            pos += U16_LENGTH(c);
            return c;
        } else {
            switchToForward();
        }
    }
}